

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O3

ngx_int_t ngx_walk_tree(ngx_tree_ctx_t *ctx,ngx_str_t *tree)

{
  DIR *__s;
  DIR *pDVar1;
  int iVar2;
  uint uVar3;
  ngx_int_t nVar4;
  void *__ptr;
  int *piVar5;
  size_t sVar6;
  long lVar7;
  __dev_t _Var8;
  char *pcVar9;
  size_t __n;
  ngx_log_t *pnVar10;
  ngx_uint_t level;
  u_char *puVar11;
  ngx_int_t nVar12;
  void *pvVar13;
  bool bVar14;
  undefined1 local_118 [8];
  ngx_dir_t dir;
  undefined1 local_58 [8];
  ngx_str_t file;
  void *local_40;
  ulong local_38;
  
  if ((ctx->log->log_level & 0x10) != 0) {
    ngx_log_error_core(8,ctx->log,0,"walk tree \"%V\"",tree);
  }
  nVar4 = ngx_open_dir(tree,(ngx_dir_t *)local_118);
  if (nVar4 == -1) {
    pnVar10 = ctx->log;
    nVar12 = -1;
    if (pnVar10->log_level < 3) {
      return -1;
    }
    piVar5 = __errno_location();
    iVar2 = *piVar5;
    puVar11 = tree->data;
    pcVar9 = "opendir() \"%s\" failed";
    goto LAB_0011ba5c;
  }
  pvVar13 = ctx->data;
  if (ctx->alloc == 0) {
    __ptr = (void *)0x0;
LAB_0011b614:
    piVar5 = __errno_location();
    *piVar5 = 0;
    nVar4 = ngx_read_dir((ngx_dir_t *)local_118);
    if (nVar4 != -1) {
      local_38 = 0;
      local_40 = (void *)0x0;
      dir._160_8_ = pvVar13;
      file.data = (u_char *)tree;
LAB_0011b655:
      pDVar1 = dir.dir;
      __s = dir.dir + 0x13;
      sVar6 = strlen((char *)__s);
      if ((ctx->log->log_level & 0x10) != 0) {
        ngx_log_error_core(8,ctx->log,0,"tree name %uz:\"%s\"",sVar6,__s);
      }
      if (sVar6 != 2) {
        if ((sVar6 != 1) || (*__s != (DIR)0x2e)) goto LAB_0011b6d5;
LAB_0011b6b4:
        *piVar5 = 0;
        lVar7 = ngx_read_dir((ngx_dir_t *)local_118);
        tree = (ngx_str_t *)file.data;
        goto joined_r0x0011b6ce;
      }
      if ((*__s == (DIR)0x2e) && (pDVar1[0x14] == (DIR)0x2e)) goto LAB_0011b6b4;
LAB_0011b6d5:
      __n = *(size_t *)file.data;
      local_58 = (undefined1  [8])(sVar6 + __n + 1);
      if (local_38 < (ulong)local_58) {
        bVar14 = local_38 != 0;
        local_38 = (ulong)local_58;
        if (bVar14) {
          free(local_40);
          local_38 = *(long *)file.data + sVar6 + 1;
        }
        local_40 = ngx_alloc(local_38 + 1,ctx->log);
        if (local_40 == (void *)0x0) {
          nVar12 = -6;
          local_40 = (void *)0x0;
          tree = (ngx_str_t *)file.data;
          pvVar13 = (void *)dir._160_8_;
          goto LAB_0011ba0f;
        }
        __n = *(size_t *)file.data;
      }
      tree = (ngx_str_t *)file.data;
      memcpy(local_40,*(void **)(file.data + 8),__n);
      lVar7 = *(long *)tree;
      *(undefined1 *)((long)local_40 + lVar7) = 0x2f;
      memcpy((undefined1 *)((long)local_40 + lVar7) + 1,__s,sVar6 + 1);
      pvVar13 = (void *)dir._160_8_;
      file.len = (size_t)local_40;
      if ((ctx->log->log_level & 0x10) != 0) {
        ngx_log_error_core(8,ctx->log,0,"tree path \"%s\"",local_40);
      }
      uVar3 = (uint)dir.info.__glibc_reserved[2];
      if (((uint)dir.info.__glibc_reserved[2] >> 8 & 1) == 0) {
        dir.info.__glibc_reserved[2]._0_4_ = (uint)dir.info.__glibc_reserved[2] & 0xfffffe00;
        iVar2 = stat64((char *)file.len,(stat64 *)&dir.de);
        if (iVar2 != -1) {
          uVar3 = (uint)dir.info.__glibc_reserved[2] & 0xffff;
          goto LAB_0011b7c3;
        }
        pnVar10 = ctx->log;
        if (2 < pnVar10->log_level) {
          iVar2 = *piVar5;
          level = 3;
          pcVar9 = "stat() \"%s\" failed";
LAB_0011b987:
          ngx_log_error_core(level,pnVar10,iVar2,pcVar9,file.len);
        }
      }
      else {
LAB_0011b7c3:
        if ((char)uVar3 == '\b') {
LAB_0011b7fa:
          if ((ctx->log->log_level & 0x10) != 0) {
            ngx_log_error_core(8,ctx->log,0,"tree file \"%s\"",file.len);
          }
          ctx->size = dir.info.st_rdev;
          _Var8 = dir.info.st_blksize * 0x200;
          if (dir.info.st_blksize * 0x200 < (long)dir.info.st_rdev) {
            _Var8 = dir.info.st_rdev;
          }
          ctx->fs_size = _Var8;
          ctx->access = (ulong)((uint)dir.info.st_nlink & 0x1ff);
          ctx->mtime = dir.info.st_atim.tv_nsec;
          lVar7 = (*ctx->file_handler)(ctx,(ngx_str_t *)local_58);
        }
        else {
          if ((uVar3 & 0xff) == 4) {
LAB_0011b865:
            if ((ctx->log->log_level & 0x10) != 0) {
              ngx_log_error_core(8,ctx->log,0,"tree enter dir \"%s\"",file.len);
            }
            ctx->access = (ulong)((uint)dir.info.st_nlink & 0x1ff);
            ctx->mtime = dir.info.st_atim.tv_nsec;
            nVar12 = (*ctx->pre_tree_handler)(ctx,(ngx_str_t *)local_58);
            if (nVar12 == -5) {
              pnVar10 = ctx->log;
              if ((pnVar10->log_level & 0x10) != 0) {
                level = 8;
                iVar2 = 0;
                pcVar9 = "tree skip dir \"%s\"";
                goto LAB_0011b987;
              }
              goto LAB_0011b98e;
            }
            if (nVar12 == -6) goto LAB_0011ba0f;
            nVar4 = ngx_walk_tree(ctx,(ngx_str_t *)local_58);
            nVar12 = -6;
            if (nVar4 == -6) goto LAB_0011ba0f;
            ctx->access = (ulong)((uint)dir.info.st_nlink & 0x1ff);
            ctx->mtime = dir.info.st_atim.tv_nsec;
            nVar4 = (*ctx->post_tree_handler)(ctx,(ngx_str_t *)local_58);
            if (nVar4 == -6) goto LAB_0011ba0f;
            goto LAB_0011b98e;
          }
          if ((uVar3 & 0xff) == 0) {
            if (((uint)dir.info.st_nlink & 0xf000) == 0x4000) goto LAB_0011b865;
            if (((uint)dir.info.st_nlink & 0xf000) == 0x8000) goto LAB_0011b7fa;
          }
          if ((ctx->log->log_level & 0x10) != 0) {
            ngx_log_error_core(8,ctx->log,0,"tree special \"%s\"",file.len);
          }
          lVar7 = (*ctx->spec_handler)(ctx,(ngx_str_t *)local_58);
        }
        if (lVar7 == -6) {
          nVar12 = -6;
          goto LAB_0011ba0f;
        }
      }
LAB_0011b98e:
      *piVar5 = 0;
      lVar7 = ngx_read_dir((ngx_dir_t *)local_118);
joined_r0x0011b6ce:
      if (lVar7 == -1) goto LAB_0011b9d3;
      goto LAB_0011b655;
    }
    local_40 = (void *)0x0;
    local_38 = 0;
LAB_0011b9d3:
    if (*piVar5 == 0) {
      nVar12 = 0;
    }
    else {
      nVar12 = -1;
      if (2 < ctx->log->log_level) {
        ngx_log_error_core(3,ctx->log,*piVar5,"readdir() \"%s\" failed",tree->data);
      }
    }
LAB_0011ba0f:
    if (local_38 != 0) {
      free(local_40);
    }
    if (__ptr != (void *)0x0) goto LAB_0011ba22;
  }
  else {
    __ptr = ngx_alloc(ctx->alloc,ctx->log);
    if (__ptr == (void *)0x0) {
      nVar12 = -6;
    }
    else {
      nVar4 = (*ctx->init_handler)(__ptr,pvVar13);
      nVar12 = -6;
      if (nVar4 != -6) {
        ctx->data = __ptr;
        goto LAB_0011b614;
      }
LAB_0011ba22:
      free(__ptr);
      ctx->data = pvVar13;
    }
  }
  iVar2 = closedir((DIR *)local_118);
  if (iVar2 != -1) {
    return nVar12;
  }
  pnVar10 = ctx->log;
  if (pnVar10->log_level < 3) {
    return nVar12;
  }
  piVar5 = __errno_location();
  iVar2 = *piVar5;
  puVar11 = tree->data;
  pcVar9 = "closedir() \"%s\" failed";
LAB_0011ba5c:
  ngx_log_error_core(3,pnVar10,iVar2,pcVar9,puVar11);
  return nVar12;
}

Assistant:

ngx_int_t
ngx_walk_tree(ngx_tree_ctx_t *ctx, ngx_str_t *tree)
{
    void       *data, *prev;
    u_char     *p, *name;
    size_t      len;
    ngx_int_t   rc;
    ngx_err_t   err;
    ngx_str_t   file, buf;
    ngx_dir_t   dir;

    ngx_str_null(&buf);

    ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                   "walk tree \"%V\"", tree);

    if (ngx_open_dir(tree, &dir) == NGX_ERROR) {
        ngx_log_error(NGX_LOG_CRIT, ctx->log, ngx_errno,
                      ngx_open_dir_n " \"%s\" failed", tree->data);
        return NGX_ERROR;
    }

    prev = ctx->data;

    if (ctx->alloc) {
        data = ngx_alloc(ctx->alloc, ctx->log);
        if (data == NULL) {
            goto failed;
        }

        if (ctx->init_handler(data, prev) == NGX_ABORT) {
            goto failed;
        }

        ctx->data = data;

    } else {
        data = NULL;
    }

    for ( ;; ) {

        ngx_set_errno(0);

        if (ngx_read_dir(&dir) == NGX_ERROR) {
            err = ngx_errno;

            if (err == NGX_ENOMOREFILES) {
                rc = NGX_OK;

            } else {
                ngx_log_error(NGX_LOG_CRIT, ctx->log, err,
                              ngx_read_dir_n " \"%s\" failed", tree->data);
                rc = NGX_ERROR;
            }

            goto done;
        }

        len = ngx_de_namelen(&dir);
        name = ngx_de_name(&dir);

        ngx_log_debug2(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                      "tree name %uz:\"%s\"", len, name);

        if (len == 1 && name[0] == '.') {
            continue;
        }

        if (len == 2 && name[0] == '.' && name[1] == '.') {
            continue;
        }

        file.len = tree->len + 1 + len;

        if (file.len + NGX_DIR_MASK_LEN > buf.len) {

            if (buf.len) {
                ngx_free(buf.data);
            }

            buf.len = tree->len + 1 + len + NGX_DIR_MASK_LEN;

            buf.data = ngx_alloc(buf.len + 1, ctx->log);
            if (buf.data == NULL) {
                goto failed;
            }
        }

        p = ngx_cpymem(buf.data, tree->data, tree->len);
        *p++ = '/';
        ngx_memcpy(p, name, len + 1);

        file.data = buf.data;

        ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                       "tree path \"%s\"", file.data);

        if (!dir.valid_info) {
            if (ngx_de_info(file.data, &dir) == NGX_FILE_ERROR) {
                ngx_log_error(NGX_LOG_CRIT, ctx->log, ngx_errno,
                              ngx_de_info_n " \"%s\" failed", file.data);
                continue;
            }
        }

        if (ngx_de_is_file(&dir)) {

            ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                           "tree file \"%s\"", file.data);

            ctx->size = ngx_de_size(&dir);
            ctx->fs_size = ngx_de_fs_size(&dir);
            ctx->access = ngx_de_access(&dir);
            ctx->mtime = ngx_de_mtime(&dir);

            if (ctx->file_handler(ctx, &file) == NGX_ABORT) {
                goto failed;
            }

        } else if (ngx_de_is_dir(&dir)) {

            ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                           "tree enter dir \"%s\"", file.data);

            ctx->access = ngx_de_access(&dir);
            ctx->mtime = ngx_de_mtime(&dir);

            rc = ctx->pre_tree_handler(ctx, &file);

            if (rc == NGX_ABORT) {
                goto failed;
            }

            if (rc == NGX_DECLINED) {
                ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                               "tree skip dir \"%s\"", file.data);
                continue;
            }

            if (ngx_walk_tree(ctx, &file) == NGX_ABORT) {
                goto failed;
            }

            ctx->access = ngx_de_access(&dir);
            ctx->mtime = ngx_de_mtime(&dir);

            if (ctx->post_tree_handler(ctx, &file) == NGX_ABORT) {
                goto failed;
            }

        } else {

            ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                           "tree special \"%s\"", file.data);

            if (ctx->spec_handler(ctx, &file) == NGX_ABORT) {
                goto failed;
            }
        }
    }

failed:

    rc = NGX_ABORT;

done:

    if (buf.len) {
        ngx_free(buf.data);
    }

    if (data) {
        ngx_free(data);
        ctx->data = prev;
    }

    if (ngx_close_dir(&dir) == NGX_ERROR) {
        ngx_log_error(NGX_LOG_CRIT, ctx->log, ngx_errno,
                      ngx_close_dir_n " \"%s\" failed", tree->data);
    }

    return rc;
}